

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

int __thiscall
TPZCompElH1<pzshape::TPZShapeLinear>::EffectiveSideOrder
          (TPZCompElH1<pzshape::TPZShapeLinear> *this,int side)

{
  byte bVar1;
  long *plVar2;
  ostream *poVar3;
  void *this_00;
  TPZGeoEl *pTVar4;
  TPZConnect *pTVar5;
  long lVar6;
  int64_t iVar7;
  int *piVar8;
  int in_ESI;
  long *in_RDI;
  TPZConnect *c_1;
  int is;
  int order;
  TPZConnect *c;
  TPZStack<int,_10> lowdim;
  stringstream sout;
  size_t in_stack_00000188;
  char *in_stack_00000190;
  TPZCompEl *in_stack_fffffffffffffd78;
  TPZStack<int,_10> *in_stack_fffffffffffffd80;
  int local_228;
  uint local_224;
  TPZVec<int> local_218 [2];
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [380];
  int local_14;
  uint local_4;
  
  if ((in_ESI < 2) || (2 < in_ESI)) {
    local_4 = 0;
  }
  else {
    local_14 = in_ESI;
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 9),(long)in_ESI);
    if (*plVar2 == -1) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      poVar3 = std::operator<<(local_190,
                               "virtual int TPZCompElH1<pzshape::TPZShapeLinear>::EffectiveSideOrder(int) const [TSHAPE = pzshape::TPZShapeLinear]"
                              );
      poVar3 = std::operator<<(poVar3," side ");
      this_00 = (void *)std::ostream::operator<<(poVar3,local_14);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      poVar3 = std::operator<<((ostream *)&std::cout,local_1d0);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1d0);
      pzinternal::DebugStopImpl(in_stack_00000190,in_stack_00000188);
      local_4 = 0xffffffff;
      std::__cxx11::stringstream::~stringstream(local_1a0);
    }
    else {
      TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffd80);
      pTVar4 = TPZCompEl::Reference(in_stack_fffffffffffffd78);
      (**(code **)(*(long *)pTVar4 + 0x220))(pTVar4,local_14,local_218);
      pTVar5 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_14);
      bVar1 = TPZConnect::Order(pTVar5);
      local_224 = (uint)bVar1;
      local_228 = 0;
      while( true ) {
        lVar6 = (long)local_228;
        iVar7 = TPZVec<int>::size(local_218);
        if (iVar7 <= lVar6) break;
        piVar8 = TPZVec<int>::operator[](local_218,(long)local_228);
        pTVar5 = (TPZConnect *)(**(code **)(*in_RDI + 0x318))(in_RDI,*piVar8);
        bVar1 = TPZConnect::Order(pTVar5);
        if (local_224 < bVar1) {
          bVar1 = TPZConnect::Order(pTVar5);
          local_224 = (uint)bVar1;
        }
        local_228 = local_228 + 1;
      }
      local_4 = local_224;
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1c03b6b);
    }
  }
  return local_4;
}

Assistant:

int TPZCompElH1<TSHAPE>::EffectiveSideOrder(int side) const {

	if(side < TSHAPE::NCornerNodes || side >= TSHAPE::NSides) return 0;
	if(fConnectIndexes[side] == -1)
	{
		std::stringstream sout ;
		sout << __PRETTY_FUNCTION__ << " side " << side << std::endl;
		//Print(sout);
#ifdef PZ_LOG
		LOGPZ_ERROR(logger,sout.str());
#else
		std::cout << sout.str() << std::endl;
#endif
		DebugStop();
		return -1;
	}
    TPZStack<int> lowdim;
    this->Reference()->LowerDimensionSides(side,lowdim);
	TPZConnect &c = this->Connect(side);
	int order = c.Order();
    for (int is=0; is<lowdim.size(); is++) {
        TPZConnect &c = this->MidSideConnect(lowdim[is]);
        if(c.Order() > order) order = c.Order();
    }
    return order;
}